

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::alloc_chunk(ImChunkStream<ImGuiTableSettings> *this,size_t sz)

{
  int iVar1;
  int iVar2;
  char *__src;
  char *__dest;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = (this->Buf).Size;
  uVar4 = (int)sz + 7U & 0xfffffffc;
  iVar5 = iVar1 + uVar4;
  iVar2 = (this->Buf).Capacity;
  if (iVar2 < iVar5) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      __dest = (char *)ImGui::MemAlloc((long)iVar6);
      __src = (this->Buf).Data;
      if (__src != (char *)0x0) {
        memcpy(__dest,__src,(long)(this->Buf).Size);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar6;
    }
  }
  (this->Buf).Size = iVar5;
  puVar3 = (uint *)((this->Buf).Data + iVar1);
  *puVar3 = uVar4;
  return (ImGuiTableSettings *)(puVar3 + 1);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }